

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O2

bool __thiscall llvm::sys::SmartMutex<true>::unlock(SmartMutex<true> *this)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = llvm_is_multithreaded();
  if (bVar2) {
    bVar2 = MutexImpl::release(&this->impl);
    return bVar2;
  }
  uVar1 = this->acquired;
  if ((byte)(uVar1 == 1 | uVar1 != 0 & this->recursive) == 1) {
    this->acquired = uVar1 - 1;
    return true;
  }
  __assert_fail("((recursive && acquired) || (acquired == 1)) && \"Lock not acquired before release!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Mutex.h"
                ,0x79,"bool llvm::sys::SmartMutex<true>::unlock() [mt_only = true]");
}

Assistant:

bool unlock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.release();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert(((recursive && acquired) || (acquired == 1)) &&
                 "Lock not acquired before release!");
          --acquired;
          return true;
        }
      }